

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_reader.c
# Opt level: O0

void config_close(config_t t_config)

{
  ulong local_20;
  size_t i;
  config_desc *config;
  config_t t_config_local;
  
  for (local_20 = 0; local_20 < *(ulong *)((long)t_config + 0x8018); local_20 = local_20 + 1) {
    free(*(void **)((long)t_config + local_20 * 0x20 + 0x20));
  }
  free(*t_config);
  free(*(void **)((long)t_config + 8));
  free(t_config);
  return;
}

Assistant:

void config_close(config_t t_config)
{
	config_desc * config = (config_desc *) t_config;

	size_t i;
	for (i = 0; i < config->dicts_count; i ++)
		free(config->dicts[i].file_name);

	free(config->title);
	free(config->description);
	free(config);
}